

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O0

void Mio_LibraryMatchesStart(Mio_Library_t *pLib,int fPinFilter,int fPinPerm,int fPinQuick)

{
  int iVar1;
  int iVar2;
  Vec_Mem_t *pVVar3;
  Vec_Wec_t *pVVar4;
  Mio_Cell2_t *pMVar5;
  int fPinQuick_local;
  int fPinPerm_local;
  int fPinFilter_local;
  Mio_Library_t *pLib_local;
  
  if ((((pLib->vTtMem == (Vec_Mem_t *)0x0) || (pLib->fPinFilter != fPinFilter)) ||
      (pLib->fPinPerm != fPinPerm)) || (pLib->fPinQuick != fPinQuick)) {
    if (pLib->vTtMem != (Vec_Mem_t *)0x0) {
      Mio_LibraryMatchesStop(pLib);
    }
    pLib->fPinFilter = fPinFilter;
    pLib->fPinPerm = fPinPerm;
    pLib->fPinQuick = fPinQuick;
    pVVar3 = Vec_MemAllocForTT(6,0);
    pLib->vTtMem = pVVar3;
    pVVar4 = Vec_WecAlloc(1000);
    pLib->vTt2Match = pVVar4;
    Vec_WecPushLevel(pLib->vTt2Match);
    Vec_WecPushLevel(pLib->vTt2Match);
    iVar1 = Vec_WecSize(pLib->vTt2Match);
    iVar2 = Vec_MemEntryNum(pLib->vTtMem);
    if (iVar1 != iVar2) {
      __assert_fail("Vec_WecSize(pLib->vTt2Match) == Vec_MemEntryNum(pLib->vTtMem)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mio/mioUtils.c"
                    ,0x6f0,"void Mio_LibraryMatchesStart(Mio_Library_t *, int, int, int)");
    }
    pMVar5 = Nf_StoDeriveMatches(pLib->vTtMem,pLib->vTt2Match,&pLib->nCells,fPinFilter,fPinPerm,
                                 fPinQuick);
    pLib->pCells = pMVar5;
  }
  return;
}

Assistant:

void Mio_LibraryMatchesStart( Mio_Library_t * pLib, int fPinFilter, int fPinPerm, int fPinQuick )
{
    extern Mio_Cell2_t * Nf_StoDeriveMatches( Vec_Mem_t * vTtMem, Vec_Wec_t * vTt2Match, int * pnCells, int fPinFilter, int fPinPerm, int fPinQuick );
    if ( pLib->vTtMem && pLib->fPinFilter == fPinFilter && pLib->fPinPerm == fPinPerm && pLib->fPinQuick == fPinQuick )
        return;
    if ( pLib->vTtMem )
        Mio_LibraryMatchesStop( pLib );
    pLib->fPinFilter = fPinFilter;  // pin filtering
    pLib->fPinPerm   = fPinPerm;    // pin permutation
    pLib->fPinQuick  = fPinQuick;   // pin permutation
    pLib->vTtMem     = Vec_MemAllocForTT( 6, 0 );          
    pLib->vTt2Match  = Vec_WecAlloc( 1000 ); 
    Vec_WecPushLevel( pLib->vTt2Match );
    Vec_WecPushLevel( pLib->vTt2Match );
    assert( Vec_WecSize(pLib->vTt2Match) == Vec_MemEntryNum(pLib->vTtMem) );
    pLib->pCells = Nf_StoDeriveMatches( pLib->vTtMem, pLib->vTt2Match, &pLib->nCells, fPinFilter, fPinPerm, fPinQuick );
}